

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
readCode(string *fname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  ostream *poVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  fstream f;
  char buf [4096];
  long local_1238 [4];
  byte abStack_1218 [496];
  undefined1 local_1028 [4096];
  
  std::fstream::fstream(local_1238);
  std::fstream::open((string *)local_1238,(_Ios_Openmode)in_RSI);
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
  __p->_M_string_length = 0;
  (__p->field_2)._M_local_buf[0] = '\0';
  (fname->_M_dataplus)._M_p = (pointer)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fname->_M_string_length,__p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*in_RSI,in_RSI[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not exist",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    while ((abStack_1218[*(long *)(local_1238[0] + -0x18)] & 2) == 0) {
      std::ios::widen((char)local_1238 + (char)*(long *)(local_1238[0] + -0x18));
      std::istream::getline((char *)local_1238,(long)local_1028,'\0');
      std::__cxx11::string::append((fname->_M_dataplus)._M_p);
      std::__cxx11::string::append((fname->_M_dataplus)._M_p);
    }
    std::fstream::close();
  }
  std::fstream::~fstream(local_1238);
  sVar3.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = fname;
  return (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )sVar3.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<string> readCode(const string &fname) {
    fstream f;
    f.open(fname, ios::in);
    shared_ptr<string> s(new string());
    char buf[4096];
    if (f.is_open()) {
        while (!f.eof()) {
            f.getline(buf, sizeof(buf) / sizeof(char));
            s->append(buf);
            s->append("\n");
        }
        f.close();
    } else {
        cout << "File " << fname << " is not exist" << endl;
    }
    return s;
}